

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.h
# Opt level: O0

int SetRelayOntrak(ONTRAK *pOntrak,int channel,int bOpen)

{
  int iVar1;
  size_t sVar2;
  int local_c0;
  int local_bc;
  int relay_state;
  int recvbuflen;
  char recvbuf [64];
  uint8 local_68 [4];
  int sendbuflen;
  char sendbuf [64];
  int bOpen_local;
  int channel_local;
  ONTRAK *pOntrak_local;
  
  local_bc = 0;
  local_c0 = 0;
  memset(local_68,0,0x40);
  if (bOpen == 0) {
    sprintf((char *)local_68,"1SK%d\r",(ulong)(uint)channel);
  }
  else {
    sprintf((char *)local_68,"1RK%d\r",(ulong)(uint)channel);
  }
  sVar2 = strlen((char *)local_68);
  iVar1 = WriteDataOntrak(pOntrak,local_68,(int)sVar2,pOntrak->bytedelayus);
  if (iVar1 != 0) {
    printf("Error writing data to a Ontrak. \n");
    return 1;
  }
  if ((pOntrak->bSaveRawData != 0) && (pOntrak->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_68,(long)(int)sVar2,1,(FILE *)pOntrak->pfSaveFile);
    fflush((FILE *)pOntrak->pfSaveFile);
  }
  mSleep(0x19);
  if (pOntrak->bCheckState != 0) {
    memset(local_68,0,0x40);
    sprintf((char *)local_68,"1RPK%d\r",(ulong)(uint)channel);
    sVar2 = strlen((char *)local_68);
    iVar1 = WriteDataOntrak(pOntrak,local_68,(int)sVar2,pOntrak->bytedelayus);
    if (iVar1 != 0) {
      printf("Error writing data to a Ontrak. \n");
      return 1;
    }
    if ((pOntrak->bSaveRawData != 0) && (pOntrak->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_68,(long)(int)sVar2,1,(FILE *)pOntrak->pfSaveFile);
      fflush((FILE *)pOntrak->pfSaveFile);
    }
    memset(&relay_state,0,0x40);
    local_bc = 2;
    iVar1 = ReadAllRS232Port(&pOntrak->RS232Port,(uint8 *)&relay_state,2);
    if (iVar1 != 0) {
      printf("Error reading data from a Ontrak. \n");
      return 1;
    }
    if ((pOntrak->bSaveRawData != 0) && (pOntrak->pfSaveFile != (FILE *)0x0)) {
      fwrite(&relay_state,(long)local_bc,1,(FILE *)pOntrak->pfSaveFile);
      fflush((FILE *)pOntrak->pfSaveFile);
    }
    iVar1 = __isoc99_sscanf(&relay_state,"%d",&local_c0);
    if (iVar1 != 1) {
      printf("Error reading data from a Ontrak : Invalid data. \n");
      return 4;
    }
    if (((bOpen == 1) && (local_c0 == 1)) || ((bOpen == 0 && (local_c0 == 0)))) {
      printf("Error reading data from a Ontrak : Inconsitent relay state. \n");
      return 1;
    }
  }
  return 0;
}

Assistant:

inline int SetRelayOntrak(ONTRAK* pOntrak, int channel, int bOpen)
{
	char sendbuf[MAX_NB_BYTES_ONTRAK];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ONTRAK];
	int recvbuflen = 0;
	int relay_state = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	if (bOpen)
	{
		sprintf(sendbuf, "1RK%d\r", channel);
	}
	else
	{
		sprintf(sendbuf, "1SK%d\r", channel);
	}
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Ontrak. \n");
		return EXIT_FAILURE;
	}
	if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
		fflush(pOntrak->pfSaveFile);
	}

	mSleep(25);

	if (pOntrak->bCheckState)
	{
		// Check state : 1RPK%d\r returns 0 if opened or 1 if closed. 

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sprintf(sendbuf, "1RPK%d\r", channel);
		sendbuflen = (int)strlen(sendbuf);

		if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
		{
			printf("Error writing data to a Ontrak. \n");
			return EXIT_FAILURE;
		}
		if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
		{
			fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
			fflush(pOntrak->pfSaveFile);
		}

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 2; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pOntrak->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Ontrak. \n");
			return EXIT_FAILURE;
		}
		if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pOntrak->pfSaveFile);
			fflush(pOntrak->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if (sscanf(recvbuf, "%d", &relay_state) != 1)
		{
			printf("Error reading data from a Ontrak : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}

		if (((bOpen == 1)&&(relay_state == 1))||((bOpen == 0)&&(relay_state == 0)))
		{
			printf("Error reading data from a Ontrak : Inconsitent relay state. \n");
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}